

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O1

int __thiscall Fl_Secret_Input::handle(Fl_Secret_Input *this,int event)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Fl_Window *pFVar12;
  int iVar13;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RDX;
  Fl_Boxtype FVar14;
  
  iVar11 = Fl_Input::handle::dnd_save_mark;
  switch(event) {
  case 1:
    bVar4 = Fl::option(OPTION_DND_TEXT);
    if (bVar4) {
      iVar11 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
      iVar13 = (this->super_Fl_Input).super_Fl_Input_.position_;
      iVar2 = (this->super_Fl_Input).super_Fl_Input_.mark_;
      bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
      FVar14 = (Fl_Boxtype)bVar1;
      iVar9 = Fl::box_dx(FVar14);
      iVar3 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
      iVar10 = Fl::box_dy((uint)bVar1);
      iVar7 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
      iVar5 = Fl::box_dw(FVar14);
      iVar8 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
      iVar6 = Fl::box_dh(FVar14);
      Fl_Input_::handle_mouse
                ((Fl_Input_ *)this,iVar11 + iVar9,iVar3 + iVar10,iVar7 - iVar5,iVar8 - iVar6,0);
      Fl_Input::handle::newpos = (this->super_Fl_Input).super_Fl_Input_.position_;
      Fl_Input_::position((Fl_Input_ *)this,iVar13,iVar2);
      if (((Fl::focus_ == (Fl_Widget *)this) && ((Fl::e_state & 0x10000U) == 0)) &&
         (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 7) != 5)) {
        iVar11 = (this->super_Fl_Input).super_Fl_Input_.mark_;
        if ((iVar11 <= Fl_Input::handle::newpos) &&
           (Fl_Input::handle::newpos < (this->super_Fl_Input).super_Fl_Input_.position_)) {
          Fl_Input::handle::drag_start = Fl_Input::handle::newpos;
          return 1;
        }
        if ((Fl_Input::handle::newpos < iVar11) &&
           ((this->super_Fl_Input).super_Fl_Input_.position_ <= Fl_Input::handle::newpos)) {
          Fl_Input::handle::drag_start = Fl_Input::handle::newpos;
          return 1;
        }
      }
      Fl_Input::handle::drag_start = -1;
    }
    if (Fl::focus_ != (Fl_Widget *)this) {
      Fl::focus((Fl_Widget *)this);
      (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
    }
    break;
  case 2:
    if (Fl::e_keysym == 0xfeea) {
      Fl::e_is_click = 0;
      Fl::paste((Fl_Widget *)this,0);
      goto LAB_001ba1e4;
    }
    if (Fl::e_is_click != 0) {
      in_RDX = (EVP_PKEY_CTX *)(ulong)(uint)Fl_Input::handle::drag_start;
      if (-1 < Fl_Input::handle::drag_start) {
        Fl_Input_::position((Fl_Input_ *)this,Fl_Input::handle::drag_start,
                            Fl_Input::handle::drag_start);
        Fl_Input::handle::drag_start = -1;
        goto LAB_001ba1e4;
      }
      if (Fl::e_clicks == 0) goto LAB_001ba1e4;
    }
    Fl_Input_::copy((Fl_Input_ *)this,(EVP_PKEY_CTX *)0x0,in_RDX);
LAB_001ba1e4:
    if (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 8) == 0) {
      return 1;
    }
    Fl_Widget::do_callback
              ((Fl_Widget *)this,(Fl_Widget *)this,
               (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.user_data_);
    return 1;
  case 3:
  case 4:
  case 7:
    break;
  case 5:
    bVar4 = Fl::option(OPTION_DND_TEXT);
    if ((bVar4) && (-1 < Fl_Input::handle::drag_start)) {
      if (Fl::e_is_click != 0) {
        return 1;
      }
      Fl_Input::handle::dnd_save_position = (this->super_Fl_Input).super_Fl_Input_.position_;
      Fl_Input::handle::dnd_save_mark = (this->super_Fl_Input).super_Fl_Input_.mark_;
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)this;
      Fl_Input_::copy((Fl_Input_ *)this,(EVP_PKEY_CTX *)0x0,src);
      Fl::dnd();
      return 1;
    }
    break;
  case 6:
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar13 = (this->super_Fl_Input).super_Fl_Input_.size_;
      iVar11 = iVar13;
      break;
    case 0xff52:
      iVar11 = Fl_Input_::line_start((Fl_Input_ *)this,(this->super_Fl_Input).super_Fl_Input_.size_)
      ;
      goto LAB_001ba13c;
    case 0xff53:
      iVar11 = 0;
LAB_001ba119:
      iVar13 = 0;
      break;
    case 0xff54:
      iVar11 = 0;
LAB_001ba13c:
      Fl_Input_::up_down_position((Fl_Input_ *)this,iVar11,0);
      goto switchD_001b9c8d_caseD_3;
    default:
      if (Fl::e_keysym == 0xff09) {
        iVar11 = (this->super_Fl_Input).super_Fl_Input_.size_;
        goto LAB_001ba119;
      }
      iVar13 = (this->super_Fl_Input).super_Fl_Input_.mark_;
      iVar11 = (this->super_Fl_Input).super_Fl_Input_.position_;
    }
    Fl_Input_::position((Fl_Input_ *)this,iVar11,iVar13);
    break;
  case 8:
    if (((((Fl::e_keysym == 0xff09) &&
          ((Fl::e_state & 0x10000U) == 0 && (this->super_Fl_Input).super_Fl_Input_.tab_nav_ == 0))
         && (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 7) == 4)) &&
        (iVar11 = (this->super_Fl_Input).super_Fl_Input_.size_, 0 < iVar11)) &&
       (((iVar13 = (this->super_Fl_Input).super_Fl_Input_.mark_, iVar13 == 0 &&
         ((this->super_Fl_Input).super_Fl_Input_.position_ == iVar11)) ||
        ((iVar13 == iVar11 && ((this->super_Fl_Input).super_Fl_Input_.position_ == 0)))))) {
      iVar11 = (this->super_Fl_Input).super_Fl_Input_.position_;
      if (iVar11 < iVar13) {
        iVar11 = iVar13;
      }
      Fl_Input_::position((Fl_Input_ *)this,iVar11,iVar11);
      return 1;
    }
    iVar11 = Fl_Widget::active_r((Fl_Widget *)this);
    if (((iVar11 != 0) &&
        (pFVar12 = Fl_Widget::window((Fl_Widget *)this), pFVar12 != (Fl_Window *)0x0)) &&
       (Fl::belowmouse_ == (Fl_Widget *)this)) {
      pFVar12 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar12,FL_CURSOR_NONE);
    }
    iVar11 = Fl_Input::handle_key(&this->super_Fl_Input);
    return iVar11;
  default:
    switch(event) {
    case 0x14:
      Fl::belowmouse((Fl_Widget *)this);
      if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)this) {
        Fl_Input::handle::dnd_save_position = (this->super_Fl_Input).super_Fl_Input_.position_;
        Fl_Input::handle::dnd_save_mark = (this->super_Fl_Input).super_Fl_Input_.mark_;
        Fl_Input::handle::dnd_save_focus = Fl::focus_;
        Fl::focus((Fl_Widget *)this);
        (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      }
    case 0x15:
      bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
      FVar14 = (Fl_Boxtype)bVar1;
      iVar11 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
      iVar7 = Fl::box_dx(FVar14);
      iVar13 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
      iVar8 = Fl::box_dy((uint)bVar1);
      iVar2 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
      iVar9 = Fl::box_dw(FVar14);
      iVar3 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
      iVar10 = Fl::box_dh(FVar14);
      Fl_Input_::handle_mouse
                ((Fl_Input_ *)this,iVar11 + iVar7,iVar13 + iVar8,iVar2 - iVar9,iVar3 - iVar10,0);
      break;
    case 0x16:
      Fl_Input_::position((Fl_Input_ *)this,Fl_Input::handle::dnd_save_position,
                          Fl_Input::handle::dnd_save_mark);
      if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)this &&
          Fl_Input::handle::dnd_save_focus != (Fl_Widget *)0x0) {
        Fl::focus(Fl_Input::handle::dnd_save_focus);
        (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,7);
      }
      pFVar12 = Fl::first_window();
      Fl_Window::cursor(pFVar12,FL_CURSOR_MOVE);
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)0x0;
      break;
    case 0x17:
      if (Fl_Input::handle::dnd_save_focus == (Fl_Widget *)this) {
        iVar13 = (this->super_Fl_Input).super_Fl_Input_.position_;
        if (Fl_Input::handle::dnd_save_position < Fl_Input::handle::dnd_save_mark) {
          Fl_Input::handle::dnd_save_mark = Fl_Input::handle::dnd_save_position;
          Fl_Input::handle::dnd_save_position = iVar11;
        }
        Fl_Input_::replace((Fl_Input_ *)this,Fl_Input::handle::dnd_save_mark,
                           Fl_Input::handle::dnd_save_position,(char *)0x0,0);
        if (Fl_Input::handle::dnd_save_position < iVar13) {
          iVar13 = (Fl_Input::handle::dnd_save_mark - Fl_Input::handle::dnd_save_position) + iVar13;
        }
        Fl_Input_::position((Fl_Input_ *)this,iVar13,iVar13);
      }
      else if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)0x0) {
        (*Fl_Input::handle::dnd_save_focus->_vptr_Fl_Widget[3])(Fl_Input::handle::dnd_save_focus,7);
      }
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)0x0;
      Fl_Widget::take_focus((Fl_Widget *)this);
      break;
    default:
      goto switchD_001b9c8d_caseD_3;
    }
    return 1;
  }
switchD_001b9c8d_caseD_3:
  bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
  FVar14 = (Fl_Boxtype)bVar1;
  iVar11 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
  iVar7 = Fl::box_dx(FVar14);
  iVar13 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
  iVar8 = Fl::box_dy((uint)bVar1);
  iVar2 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
  iVar9 = Fl::box_dw(FVar14);
  iVar3 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
  iVar10 = Fl::box_dh(FVar14);
  iVar11 = Fl_Input_::handletext
                     ((Fl_Input_ *)this,event,iVar11 + iVar7,iVar13 + iVar8,iVar2 - iVar9,
                      iVar3 - iVar10);
  return iVar11;
}

Assistant:

int Fl_Secret_Input::handle(int event) {
  int retval = Fl_Input::handle(event);
#ifdef __APPLE__
  if (event == FL_KEYBOARD && Fl::compose_state) {
    this->mark( this->position() ); // don't underline marked text
  }
#endif
  return retval;
}